

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O2

string * __thiscall
duckdb::LogicalOperator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LogicalOperator *this,ExplainFormat format)

{
  pointer this_00;
  type root;
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> tree;
  stringstream ss;
  undefined1 auStack_1a8 [32];
  ostream local_188 [376];
  
  TreeRenderer::CreateRenderer((TreeRenderer *)(auStack_1a8 + 8),format);
  ::std::__cxx11::stringstream::stringstream((stringstream *)(auStack_1a8 + 0x10));
  RenderTree::CreateRenderTree((RenderTree *)auStack_1a8,this);
  this_00 = unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>::
            operator->((unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>
                        *)(auStack_1a8 + 8));
  root = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                   ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *
                    )auStack_1a8);
  TreeRenderer::ToStream(this_00,root,local_188);
  ::std::__cxx11::stringbuf::str();
  std::unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_>::~unique_ptr
            ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_> *)auStack_1a8
            );
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_1a8 + 0x10));
  if ((long *)auStack_1a8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)auStack_1a8._8_8_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

string LogicalOperator::ToString(ExplainFormat format) const {
	auto renderer = TreeRenderer::CreateRenderer(format);
	stringstream ss;
	auto tree = RenderTree::CreateRenderTree(*this);
	renderer->ToStream(*tree, ss);
	return ss.str();
}